

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_SwapNonOptionalMessageField_Test::
Proto3OptionalTest_SwapNonOptionalMessageField_Test
          (Proto3OptionalTest_SwapNonOptionalMessageField_Test *this)

{
  Proto3OptionalTest_SwapNonOptionalMessageField_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__Proto3OptionalTest_SwapNonOptionalMessageField_Test_029e3a10;
  return;
}

Assistant:

TEST(Proto3OptionalTest, SwapNonOptionalMessageField) {
  proto2_unittest::TestProto3OptionalMessage msg1;
  proto2_unittest::TestProto3OptionalMessage msg2;
  msg1.mutable_nested_message();
  const google::protobuf::Descriptor* d = msg1.GetDescriptor();
  const google::protobuf::Reflection* r = msg1.GetReflection();
  const google::protobuf::FieldDescriptor* f = d->FindFieldByName("nested_message");
  r->SwapFields(&msg1, &msg2, {f});
}